

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# om.h
# Opt level: O3

void __thiscall om::concurrency::queue<int>::enqueue(queue<int> *this,int item_)

{
  int *piVar1;
  int iVar2;
  int local_1c;
  
  local_1c = item_;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar2 == 0) {
    piVar1 = (this->_queue).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (piVar1 == (this->_queue).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<int,_std::allocator<int>_>::_M_push_back_aux<int>(&(this->_queue).c,&local_1c);
    }
    else {
      *piVar1 = item_;
      (this->_queue).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
      _M_finish._M_cur = piVar1 + 1;
    }
    std::condition_variable::notify_one();
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void enqueue(T item_)
			{
				std::lock_guard<std::mutex> lock(_mutex);
				_queue.push(std::move(item_));
				_condition.notify_one();
			}